

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::BaseGeometryInterface::unrequireInteriorVertexIndices
          (BaseGeometryInterface *this)

{
  int iVar1;
  logic_error *this_00;
  
  iVar1 = (this->interiorVertexIndicesQ).super_DependentQuantity.requireCount;
  (this->interiorVertexIndicesQ).super_DependentQuantity.requireCount = iVar1 + -1;
  if (0 < iVar1) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error
            (this_00,"Quantity was unrequire()\'d more than than it was require()\'d");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

void BaseGeometryInterface::refreshQuantities() {
  for (DependentQuantity* q : quantities) {
    q->computed = false;
  }
  for (DependentQuantity* q : quantities) {
    q->ensureHaveIfRequired();
  }
}